

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_UpdateCue(FACTCue *cue)

{
  long *plVar1;
  long lVar2;
  float *in_RDI;
  FACTSoundInstance *sound;
  float next;
  uint32_t i;
  FACTWave *in_stack_00000028;
  uint16_t in_stack_00000076;
  FACTCue *in_stack_00000078;
  float in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar3;
  
  if (((**(byte **)(in_RDI + 8) & 4) == 0) && (**(char **)(in_RDI + 10) == '\x03')) {
    if ((*(byte *)(*(long *)(**(long **)in_RDI + 0x58) +
                  (long)*(short *)(*(long *)(in_RDI + 10) + 2) * 0x10) & 4) == 0) {
      FACTAudioEngine_GetGlobalVariable
                ((FACTAudioEngine *)CONCAT26(sound._6_2_,sound._0_6_),
                 (uint16_t)((ulong)in_RDI >> 0x30),
                 (float *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    else {
      FACTCue_GetVariable(_next,sound._6_2_,in_RDI);
    }
    if ((in_stack_fffffffffffffff0 != in_RDI[0xe]) ||
       (NAN(in_stack_fffffffffffffff0) || NAN(in_RDI[0xe]))) {
      in_RDI[0xe] = in_stack_fffffffffffffff0;
      if (*(long *)(in_RDI + 0x12) != 0) {
        plVar1 = *(long **)(in_RDI + 0x12);
        *(undefined8 *)(plVar1[6] + 0x48) = 0;
        for (uVar3 = 0; uVar3 < *(byte *)(*plVar1 + 0xb); uVar3 = uVar3 + 1) {
          if (*(long *)(plVar1[1] + (ulong)uVar3 * 0x68 + 0x28) != 0) {
            FACTWave_Destroy(in_stack_00000028);
          }
          if (*(long *)(plVar1[1] + (ulong)uVar3 * 0x68 + 0x40) != 0) {
            FACTWave_Destroy(in_stack_00000028);
          }
          (**(code **)(**(long **)in_RDI + 0xd0))(*(undefined8 *)(plVar1[1] + (ulong)uVar3 * 0x68));
        }
        (**(code **)(**(long **)in_RDI + 0xd0))(plVar1[1]);
        if (*(short *)(*plVar1 + 2) != -1) {
          lVar2 = *(long *)(**(long **)plVar1[6] + 0x50) + (ulong)*(ushort *)(*plVar1 + 2) * 0x18;
          *(char *)(lVar2 + 0x11) = *(char *)(lVar2 + 0x11) + -1;
        }
      }
      FACT_INTERNAL_CreateSound(in_stack_00000078,in_stack_00000076);
    }
  }
  return;
}

Assistant:

void FACT_INTERNAL_UpdateCue(FACTCue *cue)
{
	uint32_t i;
	float next;
	FACTSoundInstance *sound;

	/* Interactive sound selection */
	if (!(cue->data->flags & 0x04) && cue->variation->flags == 3)
	{
		/* Interactive */
		if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
		{
			FACTCue_GetVariable(
				cue,
				cue->variation->variable,
				&next
			);
		}
		else
		{
			FACTAudioEngine_GetGlobalVariable(
				cue->parentBank->parentEngine,
				cue->variation->variable,
				&next
			);
		}
		if (next != cue->interactive)
		{
			cue->interactive = next;

			/* New sound, time for death! */
			if (cue->playingSound != NULL)
			{
				/* Copy of DestroySound but does not set Cue to STOPPED */
				sound = cue->playingSound;
				sound->parentCue->playingSound = NULL;
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					if (sound->tracks[i].activeWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].activeWave.wave
						);
					}
					if (sound->tracks[i].upcomingWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].upcomingWave.wave
						);
					}
					cue->parentBank->parentEngine->pFree(
						sound->tracks[i].events
					);
				}
				cue->parentBank->parentEngine->pFree(sound->tracks);

				if (sound->sound->category != FACTCATEGORY_INVALID)
				{
					sound->parentCue->parentBank->parentEngine->categories[
						sound->sound->category
					].instanceCount -= 1;
				}
			}

			/* TODO: Reset cue times? Transition tables...?
			cue->start = elapsed;
			cue->elapsed = 0;
			 */

			FACT_INTERNAL_CreateSound(cue, 0 /* fadeIn */);
		}
	}
}